

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_statics.cpp
# Opt level: O0

ON_Xform * Internal_ON_Xform_Init(ON_Xform *__return_storage_ptr__,double x,bool bDiagonal)

{
  ON_Xform *xform;
  double *p1;
  double *p;
  bool bDiagonal_local;
  double x_local;
  
  ON_Xform::ON_Xform(__return_storage_ptr__);
  memset(__return_storage_ptr__,0,0x80);
  if (bDiagonal) {
    __return_storage_ptr__->m_xform[0][0] = x;
    __return_storage_ptr__->m_xform[1][1] = x;
    __return_storage_ptr__->m_xform[2][2] = x;
    __return_storage_ptr__->m_xform[3][3] = 1.0;
  }
  else {
    p1 = (double *)__return_storage_ptr__;
    while (p1 < __return_storage_ptr__ + 1) {
      *p1 = x;
      p1 = p1 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static ON_Xform Internal_ON_Xform_Init(double x, bool bDiagonal)
{
  ON_Xform xform;
  memset(&xform, 0, sizeof(xform));
  if (bDiagonal)
  {
    xform.m_xform[0][0] = x;
    xform.m_xform[1][1] = x;
    xform.m_xform[2][2] = x;
    xform.m_xform[3][3] = 1.0;
  }
  else
  {
    double* p = &xform.m_xform[0][0];
    double* p1 = p + 16;
    while (p < p1)
      *p++ = x;
  }
  return xform;
}